

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTAC.cpp
# Opt level: O3

void __thiscall MiniScript::Context::StoreValue(Context *this,Value *lhs,Value *value)

{
  long *plVar1;
  bool *pbVar2;
  RefCountedStorage *pRVar3;
  anon_union_8_3_2f476f46_for_data aVar4;
  _func_int **pp_Var5;
  int iVar6;
  Context *context;
  Value index;
  Value seq;
  undefined1 local_c0 [2];
  LocalOnlyMode local_be;
  anon_union_8_3_2f476f46_for_data local_b8;
  RuntimeException local_b0;
  Value local_80;
  Value local_70;
  Value local_60;
  Value local_50;
  Value local_40;
  anon_union_8_3_2f476f46_for_data local_30;
  char local_28;
  
  switch(lhs->type) {
  case Null:
    goto switchD_0017eddd_caseD_0;
  default:
    aVar4.ref = (RefCountedStorage *)operator_new(0x30);
    iVar6 = (int)lhs;
    (aVar4.ref)->refCount = 1;
    (aVar4.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
    aVar4.ref[1].refCount = 0xe;
    aVar4.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
    pp_Var5 = (_func_int **)operator_new__(0xe);
    aVar4.ref[1]._vptr_RefCountedStorage = pp_Var5;
    *(undefined8 *)((long)pp_Var5 + 6) = 0x65756c61766c20;
    *pp_Var5 = (_func_int *)0x6c206e6120746f6e;
    (aVar4.ref)->refCount = 2;
    local_b0.super_MiniscriptException.location.context.ss = (StringStorage *)0x0;
    local_b0.super_MiniscriptException.location.context.isTemp = false;
    local_b0.super_MiniscriptException.location.lineNum = 0;
    local_b0.super_MiniscriptException.message.isTemp = false;
    local_b0.super_MiniscriptException._0_8_ = &PTR__MiniscriptException_001bf310;
    local_b0.super_MiniscriptException.message.ss = (StringStorage *)aVar4.ref;
    RuntimeException::raise(&local_b0,iVar6);
    local_b0.super_MiniscriptException._0_8_ = &PTR__MiniscriptException_001bf360;
    if ((local_b0.super_MiniscriptException.message.ss != (StringStorage *)0x0) &&
       (local_b0.super_MiniscriptException.message.isTemp == false)) {
      plVar1 = (long *)((long)local_b0.super_MiniscriptException.message.ss + 8);
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_b0.super_MiniscriptException.message.ss)->super_RefCountedStorage).
          _vptr_RefCountedStorage[1])();
      }
      local_b0.super_MiniscriptException.message.ss = (StringStorage *)0x0;
    }
    if ((local_b0.super_MiniscriptException.location.context.ss != (StringStorage *)0x0) &&
       (local_b0.super_MiniscriptException.location.context.isTemp == false)) {
      plVar1 = (long *)((long)local_b0.super_MiniscriptException.location.context.ss + 8);
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_b0.super_MiniscriptException.location.context.ss)->super_RefCountedStorage).
          _vptr_RefCountedStorage[1])();
      }
      local_b0.super_MiniscriptException.location.context.ss = (StringStorage *)0x0;
    }
    std::exception::~exception((exception *)&local_b0);
    plVar1 = &(aVar4.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 != 0) {
      return;
    }
    pp_Var5 = (aVar4.ref)->_vptr_RefCountedStorage;
    goto LAB_0017f3d0;
  case Temp:
    iVar6 = (lhs->data).tempNum;
    local_50.type = value->type;
    local_50.noInvoke = value->noInvoke;
    local_50.localOnly = value->localOnly;
    local_50.data = (anon_union_8_3_2f476f46_for_data)(value->data).ref;
    if (local_50.data.ref != (RefCountedStorage *)0x0 && Temp < local_50.type) {
      (local_50.data.ref)->refCount = (local_50.data.ref)->refCount + 1;
    }
    SetTemp(this,iVar6,&local_50);
    local_40.data = local_50.data;
    local_40.type = local_50.type;
    break;
  case Var:
    Value::GetString((Value *)&local_30);
    local_60.type = value->type;
    local_60.noInvoke = value->noInvoke;
    local_60.localOnly = value->localOnly;
    local_60.data = (anon_union_8_3_2f476f46_for_data)(value->data).ref;
    if (local_60.data.ref != (RefCountedStorage *)0x0 && Temp < local_60.type) {
      (local_60.data.ref)->refCount = (local_60.data.ref)->refCount + 1;
    }
    SetVar(this,(String *)&local_30,&local_60);
    if ((Temp < local_60.type) && (local_60.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_60.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_60.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_60.data.number = 0.0;
    }
    if (local_30.ref == (RefCountedStorage *)0x0) {
      return;
    }
    aVar4 = local_30;
    if (local_28 != '\0') {
      return;
    }
    goto LAB_0017f2c1;
  case SeqElem:
    pRVar3 = (lhs->data).ref;
    context = (Context *)(pRVar3 + 1);
    Value::Val(&local_40,context,(ValueDict *)this);
    iVar6 = (int)context;
    if (local_40.type == Null) {
      aVar4.ref = (RefCountedStorage *)operator_new(0x30);
      (aVar4.ref)->refCount = 1;
      (aVar4.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
      aVar4.ref[1].refCount = 0x22;
      aVar4.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
      pp_Var5 = (_func_int **)operator_new__(0x22);
      aVar4.ref[1]._vptr_RefCountedStorage = pp_Var5;
      pp_Var5[2] = (_func_int *)0x6e656d656c652064;
      pp_Var5[3] = (_func_int *)0x6c756e20666f2074;
      *pp_Var5 = (_func_int *)0x65732074276e6163;
      pp_Var5[1] = (_func_int *)0x657865646e692074;
      *(undefined2 *)(pp_Var5 + 4) = 0x6c;
      (aVar4.ref)->refCount = 2;
      local_b0.super_MiniscriptException.location.context.ss = (StringStorage *)0x0;
      local_b0.super_MiniscriptException.location.context.isTemp = false;
      local_b0.super_MiniscriptException.location.lineNum = 0;
      local_b0.super_MiniscriptException.message.isTemp = false;
      local_b0.super_MiniscriptException._0_8_ = &PTR__MiniscriptException_001bf310;
      local_b0.super_MiniscriptException.message.ss = (StringStorage *)aVar4.ref;
      RuntimeException::raise(&local_b0,iVar6);
      local_b0.super_MiniscriptException._0_8_ = &PTR__MiniscriptException_001bf360;
      if ((local_b0.super_MiniscriptException.message.ss != (StringStorage *)0x0) &&
         (local_b0.super_MiniscriptException.message.isTemp == false)) {
        plVar1 = (long *)((long)local_b0.super_MiniscriptException.message.ss + 8);
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_b0.super_MiniscriptException.message.ss)->super_RefCountedStorage).
            _vptr_RefCountedStorage[1])();
        }
        local_b0.super_MiniscriptException.message.ss = (StringStorage *)0x0;
      }
      if ((local_b0.super_MiniscriptException.location.context.ss != (StringStorage *)0x0) &&
         (local_b0.super_MiniscriptException.location.context.isTemp == false)) {
        plVar1 = (long *)((long)local_b0.super_MiniscriptException.location.context.ss + 8);
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_b0.super_MiniscriptException.location.context.ss)->super_RefCountedStorage).
            _vptr_RefCountedStorage[1])();
        }
        local_b0.super_MiniscriptException.location.context.ss = (StringStorage *)0x0;
      }
      std::exception::~exception((exception *)&local_b0);
      plVar1 = &(aVar4.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(aVar4.ref)->_vptr_RefCountedStorage[1])(aVar4.number);
      }
    }
    if ((local_40.type & ~Number) != List) {
      aVar4.ref = (RefCountedStorage *)operator_new(0x30);
      (aVar4.ref)->refCount = 1;
      (aVar4.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
      aVar4.ref[1].refCount = 0x2a;
      aVar4.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
      pp_Var5 = (_func_int **)operator_new__(0x2a);
      aVar4.ref[1]._vptr_RefCountedStorage = pp_Var5;
      builtin_strncpy((char *)((long)pp_Var5 + 0x1a),"nt in th",8);
      builtin_strncpy((char *)((long)pp_Var5 + 0x22),"is type",8);
      pp_Var5[2] = (_func_int *)0x656c652064657865;
      pp_Var5[3] = (_func_int *)0x206e6920746e656d;
      *pp_Var5 = (_func_int *)0x65732074276e6163;
      pp_Var5[1] = (_func_int *)0x646e69206e612074;
      (aVar4.ref)->refCount = 2;
      local_b0.super_MiniscriptException.location.context.ss = (StringStorage *)0x0;
      local_b0.super_MiniscriptException.location.context.isTemp = false;
      local_b0.super_MiniscriptException.location.lineNum = 0;
      local_b0.super_MiniscriptException.message.isTemp = false;
      local_b0.super_MiniscriptException._0_8_ = &PTR__MiniscriptException_001bf310;
      local_b0.super_MiniscriptException.message.ss = (StringStorage *)aVar4.ref;
      RuntimeException::raise(&local_b0,iVar6);
      local_b0.super_MiniscriptException._0_8_ = &PTR__MiniscriptException_001bf360;
      if ((local_b0.super_MiniscriptException.message.ss != (StringStorage *)0x0) &&
         (local_b0.super_MiniscriptException.message.isTemp == false)) {
        plVar1 = (long *)((long)local_b0.super_MiniscriptException.message.ss + 8);
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_b0.super_MiniscriptException.message.ss)->super_RefCountedStorage).
            _vptr_RefCountedStorage[1])();
        }
        local_b0.super_MiniscriptException.message.ss = (StringStorage *)0x0;
      }
      if ((local_b0.super_MiniscriptException.location.context.ss != (StringStorage *)0x0) &&
         (local_b0.super_MiniscriptException.location.context.isTemp == false)) {
        plVar1 = (long *)((long)local_b0.super_MiniscriptException.location.context.ss + 8);
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_b0.super_MiniscriptException.location.context.ss)->super_RefCountedStorage).
            _vptr_RefCountedStorage[1])();
        }
        local_b0.super_MiniscriptException.location.context.ss = (StringStorage *)0x0;
      }
      std::exception::~exception((exception *)&local_b0);
      plVar1 = &(aVar4.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(aVar4.ref)->_vptr_RefCountedStorage[1])(aVar4.number);
      }
    }
    local_c0[0] = *(ValueType *)&pRVar3[2]._vptr_RefCountedStorage;
    local_c0[1] = *(undefined1 *)((long)&pRVar3[2]._vptr_RefCountedStorage + 1);
    local_be = *(LocalOnlyMode *)((long)&pRVar3[2]._vptr_RefCountedStorage + 2);
    local_b8 = (anon_union_8_3_2f476f46_for_data)pRVar3[2].refCount;
    if ((Context *)local_b8.ref != (Context *)0x0 && Temp < local_c0[0]) {
      (local_b8.ref)->refCount = (local_b8.ref)->refCount + 1;
    }
    if ((local_c0[0] < Handle) && ((0x184U >> (local_c0[0] & 0x1f) & 1) != 0)) {
      Value::Val((Value *)&local_b0,(Context *)local_c0,(ValueDict *)this);
      Value::operator=((Value *)local_c0,(Value *)&local_b0);
      if ((2 < (byte)local_b0.super_MiniscriptException.super_exception) &&
         (local_b0.super_MiniscriptException.location.context.ss != (StringStorage *)0x0)) {
        plVar1 = (long *)((long)local_b0.super_MiniscriptException.location.context.ss + 8);
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_b0.super_MiniscriptException.location.context.ss)->super_RefCountedStorage).
            _vptr_RefCountedStorage[1])();
        }
      }
    }
    local_70.data.number = local_b8.number;
    if ((Context *)local_b8.ref != (Context *)0x0 && Temp < local_c0[0]) {
      (local_b8.ref)->refCount = (local_b8.ref)->refCount + 1;
    }
    local_80.type = value->type;
    local_80.noInvoke = value->noInvoke;
    local_80.localOnly = value->localOnly;
    local_80.data = (anon_union_8_3_2f476f46_for_data)(value->data).ref;
    if ((ListStorage<MiniScript::Value> *)local_80.data.ref != (ListStorage<MiniScript::Value> *)0x0
        && Temp < local_80.type) {
      (local_80.data.ref)->refCount = (local_80.data.ref)->refCount + 1;
    }
    local_70.type = local_c0[0];
    local_70.noInvoke = (bool)local_c0[1];
    local_70.localOnly = local_be;
    Value::SetElem(&local_40,&local_70,&local_80);
    if ((Temp < local_80.type) &&
       ((ListStorage<MiniScript::Value> *)local_80.data.ref != (ListStorage<MiniScript::Value> *)0x0
       )) {
      plVar1 = &(local_80.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_80.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
      local_80.data.number = 0.0;
    }
    if ((2 < local_70.type) && ((Context *)local_70.data.ref != (Context *)0x0)) {
      pbVar2 = (bool *)&(local_70.data.ref)->refCount;
      *(long *)pbVar2 = *(long *)pbVar2 + -1;
      if (*(long *)pbVar2 == 0) {
        (*(code *)(((List<MiniScript::TACLine> *)&(local_70.data.ref)->_vptr_RefCountedStorage)->ls
                  ->super_RefCountedStorage).refCount)();
      }
      local_70.data.number = 0.0;
    }
    if ((Temp < local_c0[0]) && ((Context *)local_b8.ref != (Context *)0x0)) {
      pbVar2 = (bool *)&(local_b8.ref)->refCount;
      *(long *)pbVar2 = *(long *)pbVar2 + -1;
      if (*(long *)pbVar2 == 0) {
        (*(code *)(((List<MiniScript::TACLine> *)&(local_b8.ref)->_vptr_RefCountedStorage)->ls->
                  super_RefCountedStorage).refCount)();
      }
    }
  }
  if ((Temp < local_40.type) &&
     (aVar4 = local_40.data, local_40.data.ref != (RefCountedStorage *)0x0)) {
LAB_0017f2c1:
    plVar1 = &(aVar4.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      pp_Var5 = (aVar4.ref)->_vptr_RefCountedStorage;
LAB_0017f3d0:
      (*pp_Var5[1])(aVar4.number);
    }
  }
switchD_0017eddd_caseD_0:
  return;
}

Assistant:

void Context::StoreValue(Value lhs, Value value) {
//		std::cout << "Storing into " << lhs.ToString().c_str() << ": " << value.ToString().c_str() << std::endl;
		if (lhs.type == ValueType::Temp) {
			SetTemp(lhs.data.tempNum, value);
		} else if (lhs.type == ValueType::Var) {
			SetVar(lhs.GetString(), value);
		} else if (lhs.type == ValueType::SeqElem) {
			SeqElemStorage *seqElem = (SeqElemStorage*)(lhs.data.ref);
			Value seq = seqElem->sequence.Val(this);
			if (seq.IsNull()) RuntimeException("can't set indexed element of null").raise();
			if (not seq.CanSetElem()) RuntimeException("can't set an indexed element in this type").raise();
			Value index = seqElem->index;
			if (index.type == ValueType::Var or index.type == ValueType::SeqElem or
				index.type == ValueType::Temp) index = index.Val(this);
			seq.SetElem(index, value);
		} else {
			if (!lhs.IsNull()) RuntimeException("not an lvalue").raise();
		}
	}